

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

void __thiscall
proto2_unittest::TestOneof2::set_foo_enum(TestOneof2 *this,TestOneof2_NestedEnum value)

{
  bool bVar1;
  FooCase FVar2;
  uint32_t *in_RDX;
  TestOneof2_NestedEnum value_local;
  TestOneof2 *this_local;
  
  bVar1 = google::protobuf::internal::ValidateEnum((internal *)(ulong)value,0x1ef6f28,in_RDX);
  if (!bVar1) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestOneof2_NestedEnum_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.h"
                  ,0xf6a3,
                  "void proto2_unittest::TestOneof2::set_foo_enum(::proto2_unittest::TestOneof2_NestedEnum)"
                 );
  }
  FVar2 = foo_case(this);
  if (FVar2 != kFooEnum) {
    clear_foo(this);
    set_has_foo_enum(this);
  }
  *(TestOneof2_NestedEnum *)((long)&this->field_0 + 0x18) = value;
  return;
}

Assistant:

inline void TestOneof2::set_foo_enum(::proto2_unittest::TestOneof2_NestedEnum value) {

                                          assert(::google::protobuf::internal::ValidateEnum(
                                              value, ::proto2_unittest::TestOneof2_NestedEnum_internal_data_));
                                          if (foo_case() != kFooEnum) {
    clear_foo();
    set_has_foo_enum();
  }
  _impl_.foo_.foo_enum_ = value;
  // @@protoc_insertion_point(field_set:proto2_unittest.TestOneof2.foo_enum)
}